

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O3

void ZopfliFindLongestMatch
               (ZopfliBlockState *s,ZopfliHash *h,uchar *array,size_t pos,size_t size,size_t limit,
               unsigned_short *sublen,unsigned_short *distance,unsigned_short *length)

{
  long *plVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ZopfliLongestMatchCache *lmc;
  unsigned_short uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  unsigned_short *puVar15;
  size_t pos_00;
  long *plVar16;
  ushort uVar17;
  long *plVar18;
  ulong uVar19;
  bool bVar21;
  uint local_5c;
  long *plVar20;
  
  piVar14 = h->head;
  puVar15 = h->prev;
  iVar5 = h->val;
  lmc = s->lmc;
  sVar10 = limit;
  if (lmc == (ZopfliLongestMatchCache *)0x0) {
    lmc = (ZopfliLongestMatchCache *)0x0;
  }
  else {
    pos_00 = pos - s->blockstart;
    uVar9 = (ulong)lmc->length[pos_00];
    if ((uVar9 == 0) || (lmc->dist[pos_00] != 0)) {
      bVar21 = true;
      if ((limit != 0x102) && (limit < uVar9)) {
        if (sublen == (unsigned_short *)0x0) goto LAB_00105de9;
        uVar4 = ZopfliMaxCachedSublen(lmc,pos_00,uVar9);
        bVar21 = limit <= uVar4;
        lmc = s->lmc;
      }
      if ((lmc != (ZopfliLongestMatchCache *)0x0) && (bVar21)) {
        uVar17 = lmc->length[pos_00];
        if (sublen == (unsigned_short *)0x0) {
          if (limit < uVar17) {
            uVar17 = (ushort)limit;
          }
          *length = uVar17;
          puVar15 = lmc->dist + pos_00;
        }
        else {
          uVar4 = ZopfliMaxCachedSublen(lmc,pos_00,(ulong)uVar17);
          lmc = s->lmc;
          sVar10 = (size_t)lmc->length[pos_00];
          if (uVar4 < uVar17) goto LAB_00105de9;
          uVar17 = lmc->length[pos_00];
          if (limit < sVar10) {
            uVar17 = (ushort)limit;
          }
          *length = uVar17;
          ZopfliCacheToSublen(lmc,pos_00,(ulong)uVar17,sublen);
          puVar15 = sublen + *length;
        }
        *distance = *puVar15;
        return;
      }
    }
  }
LAB_00105de9:
  if (size - pos < 3) {
    *length = 0;
    *distance = 0;
  }
  else {
    uVar4 = (uint)pos & 0x7fff;
    uVar9 = size - pos;
    if (sVar10 + pos <= size) {
      uVar9 = sVar10;
    }
    plVar1 = (long *)(array + pos);
    uVar17 = *(ushort *)(piVar14 + iVar5);
    uVar2 = puVar15[uVar17];
    uVar6 = (uint)uVar17 - (uint)uVar2;
    uVar12 = uVar6 + 0x8000;
    if ((uint)uVar2 <= (uint)uVar17 && uVar6 != 0) {
      uVar12 = uVar6;
    }
    uVar8 = 1;
    local_5c = 0;
    uVar6 = 0x2000;
    do {
      uVar13 = (uint)uVar8;
      if (0x7fff < uVar12) break;
      if (uVar12 != 0) {
        plVar16 = (long *)(array + (pos - uVar12));
        uVar19 = uVar8 & 0xffff;
        if ((size <= pos + uVar19) ||
           (*(char *)((long)plVar1 + uVar19) == *(char *)((long)plVar16 + uVar19))) {
          uVar17 = h->same[uVar4];
          plVar18 = plVar1;
          if ((2 < uVar17) && ((char)*plVar1 == (char)*plVar16)) {
            uVar3 = h->same[(uint)(pos - uVar12) & 0x7fff];
            if (uVar3 <= uVar17) {
              uVar17 = uVar3;
            }
            uVar13 = (uint)uVar17;
            if (uVar9 < uVar13) {
              uVar13 = (uint)uVar9;
            }
            plVar16 = (long *)((long)plVar16 + (ulong)(uVar13 & 0xffff));
            plVar18 = (long *)((long)plVar1 + (ulong)(uVar13 & 0xffff));
          }
          for (; (plVar18 < (long *)((long)plVar1 + (uVar9 - 8)) && (*plVar18 == *plVar16));
              plVar18 = plVar18 + 1) {
            plVar16 = plVar16 + 1;
          }
          for (; (plVar20 = (long *)((long)plVar1 + uVar9),
                 plVar18 != (long *)((long)plVar1 + uVar9) &&
                 (plVar20 = plVar18, (char)*plVar18 == (char)*plVar16));
              plVar18 = (long *)((long)plVar18 + 1)) {
            plVar16 = (long *)((long)plVar16 + 1);
          }
          uVar19 = (long)plVar20 - (long)plVar1;
          uVar13 = (uint)uVar19;
          if ((ushort)uVar8 < (ushort)uVar19) {
            if (sublen != (unsigned_short *)0x0) {
              uVar7 = (uint)uVar8 + 1;
              do {
                sublen[uVar7 & 0xffff] = (unsigned_short)uVar12;
                uVar7 = uVar7 + 1;
              } while ((ushort)uVar7 <= (ushort)uVar19);
            }
            uVar8 = uVar19;
            local_5c = uVar12;
            if (uVar9 <= (uVar19 & 0xffff)) break;
          }
        }
      }
      uVar13 = (uint)uVar8;
      if (((piVar14 != h->head2) && (h->same[uVar4] <= (ushort)uVar8)) &&
         (h->val2 == h->hashval2[uVar2])) {
        puVar15 = h->prev2;
        piVar14 = h->head2;
      }
      uVar17 = puVar15[uVar2];
      if (uVar17 == uVar2) break;
      iVar5 = ((uint)uVar2 - (uint)uVar17) + 0x8000;
      if (uVar17 < uVar2) {
        iVar5 = (uint)uVar2 - (uint)uVar17;
      }
      uVar12 = uVar12 + iVar5;
      uVar8 = uVar8 & 0xffffffff;
      bVar21 = 1 < uVar6;
      uVar6 = uVar6 - 1;
      uVar2 = uVar17;
    } while (bVar21);
    uVar17 = (ushort)uVar13;
    if (lmc != (ZopfliLongestMatchCache *)0x0) {
      sVar10 = pos - s->blockstart;
      puVar15 = lmc->length;
      if (((puVar15[sVar10] != 0) && (sublen != (unsigned_short *)0x0)) &&
         ((uVar9 == 0x102 && (lmc->dist[sVar10] == 0)))) {
        uVar11 = (unsigned_short)local_5c;
        if (uVar17 < 3) {
          uVar11 = 0;
        }
        lmc->dist[sVar10] = uVar11;
        uVar11 = 0;
        if (uVar17 >= 3) {
          uVar11 = uVar17;
        }
        puVar15[sVar10] = uVar11;
        ZopfliSublenToCache(sublen,sVar10,(ulong)(uVar13 & 0xffff),lmc);
      }
    }
    *distance = (unsigned_short)local_5c;
    *length = uVar17;
  }
  return;
}

Assistant:

void ZopfliFindLongestMatch(ZopfliBlockState* s, const ZopfliHash* h,
    const unsigned char* array,
    size_t pos, size_t size, size_t limit,
    unsigned short* sublen, unsigned short* distance, unsigned short* length) {
  unsigned short hpos = pos & ZOPFLI_WINDOW_MASK, p, pp;
  unsigned short bestdist = 0;
  unsigned short bestlength = 1;
  const unsigned char* scan;
  const unsigned char* match;
  const unsigned char* arrayend;
  const unsigned char* arrayend_safe;
#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
  int chain_counter = ZOPFLI_MAX_CHAIN_HITS;  /* For quitting early. */
#endif

  unsigned dist = 0;  /* Not unsigned short on purpose. */

  int* hhead = h->head;
  unsigned short* hprev = h->prev;
  int* hhashval = h->hashval;
  int hval = h->val;

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  if (TryGetFromLongestMatchCache(s, pos, &limit, sublen, distance, length)) {
    assert(pos + *length <= size);
    return;
  }
#endif

  assert(limit <= ZOPFLI_MAX_MATCH);
  assert(limit >= ZOPFLI_MIN_MATCH);
  assert(pos < size);

  if (size - pos < ZOPFLI_MIN_MATCH) {
    /* The rest of the code assumes there are at least ZOPFLI_MIN_MATCH bytes to
       try. */
    *length = 0;
    *distance = 0;
    return;
  }

  if (pos + limit > size) {
    limit = size - pos;
  }
  arrayend = &array[pos] + limit;
  arrayend_safe = arrayend - 8;

  assert(hval < 65536);

  pp = hhead[hval];  /* During the whole loop, p == hprev[pp]. */
  p = hprev[pp];

  assert(pp == hpos);

  dist = p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

  /* Go through all distances. */
  while (dist < ZOPFLI_WINDOW_SIZE) {
    unsigned short currentlength = 0;

    assert(p < ZOPFLI_WINDOW_SIZE);
    assert(p == hprev[pp]);
    assert(hhashval[p] == hval);

    if (dist > 0) {
      assert(pos < size);
      assert(dist <= pos);
      scan = &array[pos];
      match = &array[pos - dist];

      /* Testing the byte at position bestlength first, goes slightly faster. */
      if (pos + bestlength >= size
          || *(scan + bestlength) == *(match + bestlength)) {

#ifdef ZOPFLI_HASH_SAME
        unsigned short same0 = h->same[pos & ZOPFLI_WINDOW_MASK];
        if (same0 > 2 && *scan == *match) {
          unsigned short same1 = h->same[(pos - dist) & ZOPFLI_WINDOW_MASK];
          unsigned short same = same0 < same1 ? same0 : same1;
          if (same > limit) same = limit;
          scan += same;
          match += same;
        }
#endif
        scan = GetMatch(scan, match, arrayend, arrayend_safe);
        currentlength = scan - &array[pos];  /* The found length. */
      }

      if (currentlength > bestlength) {
        if (sublen) {
          unsigned short j;
          for (j = bestlength + 1; j <= currentlength; j++) {
            sublen[j] = dist;
          }
        }
        bestdist = dist;
        bestlength = currentlength;
        if (currentlength >= limit) break;
      }
    }


#ifdef ZOPFLI_HASH_SAME_HASH
    /* Switch to the other hash once this will be more efficient. */
    if (hhead != h->head2 && bestlength >= h->same[hpos] &&
        h->val2 == h->hashval2[p]) {
      /* Now use the hash that encodes the length and first byte. */
      hhead = h->head2;
      hprev = h->prev2;
      hhashval = h->hashval2;
      hval = h->val2;
    }
#endif

    pp = p;
    p = hprev[p];
    if (p == pp) break;  /* Uninited prev value. */

    dist += p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
    chain_counter--;
    if (chain_counter <= 0) break;
#endif
  }

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  StoreInLongestMatchCache(s, pos, limit, sublen, bestdist, bestlength);
#endif

  assert(bestlength <= limit);

  *distance = bestdist;
  *length = bestlength;
  assert(pos + *length <= size);
}